

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

void __thiscall
QScrollerPrivate::createScrollingSegments
          (QScrollerPrivate *this,qreal v,qreal startPos,qreal deltaTime,qreal deltaPos,
          Orientation orientation)

{
  QScrollerPropertiesPrivate *pQVar1;
  QDebug QVar2;
  char cVar3;
  uint uVar4;
  Type TVar5;
  bool bVar6;
  ScrollType type;
  QQueue<QScrollerPrivate::ScrollSegment> *this_00;
  long in_FS_OFFSET;
  bool bVar7;
  ulong uVar8;
  double p;
  qreal qVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  double local_138;
  double local_118;
  qreal local_108;
  double local_b8;
  qreal local_a8;
  QDebug local_98;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QDebug local_58;
  QDebug local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->properties).d.d;
  bVar7 = orientation != Horizontal;
  this_00 = &this->ySegments;
  if (!bVar7) {
    this_00 = &this->xSegments;
  }
  QList<QScrollerPrivate::ScrollSegment>::clear
            (&this_00->super_QList<QScrollerPrivate::ScrollSegment>);
  dVar13 = (&(this->contentPosRange).xp)[bVar7];
  dVar12 = (&(this->contentPosRange).w)[bVar7] + dVar13;
  if (((&pQVar1->hOvershootPolicy)[bVar7] == OvershootAlwaysOff) ||
     ((pQVar1->overshootScrollDistanceFactor == 0.0 && (!NAN(pQVar1->overshootScrollDistanceFactor))
      ))) {
    bVar6 = false;
  }
  else {
    bVar6 = dVar12 != 0.0 || (&pQVar1->hOvershootPolicy)[bVar7] == OvershootAlwaysOn;
  }
  dVar11 = (&(this->viewportSize).wd)[bVar7];
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78 = 2;
    local_74 = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = lcScroller::category.name;
    QMessageLogger::debug();
    QVar2.stream = local_58.stream;
    QVar14.m_data = (storage_type *)0x1f;
    QVar14.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,startPos);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar2.stream = local_58.stream;
    QVar15.m_data = (storage_type *)0x7;
    QVar15.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,dVar12);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar2.stream = local_58.stream;
    QVar16.m_data = (storage_type *)0x2;
    QVar16.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,orientation);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::~QDebug(&local_58);
  }
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78 = 2;
    local_74 = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = lcScroller::category.name;
    QMessageLogger::debug();
    QVar2.stream = local_58.stream;
    QVar17.m_data = (storage_type *)0x4;
    QVar17.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,v);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar2.stream = local_58.stream;
    QVar18.m_data = (storage_type *)0x17;
    QVar18.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,pQVar1->decelerationFactor);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar2.stream = local_58.stream;
    QVar19.m_data = (storage_type *)0xe;
    QVar19.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    local_88.stream = local_58.stream;
    *(int *)(local_58.stream + 0x28) = *(int *)(local_58.stream + 0x28) + 1;
    uVar4 = QEasingCurve::type();
    qt_QMetaEnum_debugOperator
              (&local_80,(longlong)&local_88,(QMetaObject *)(ulong)uVar4,
               (char *)&QEasingCurve::staticMetaObject);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug(&local_58);
  }
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78 = 2;
    local_74 = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = lcScroller::category.name;
    QMessageLogger::debug();
    QVar2.stream = local_58.stream;
    QVar20.m_data = (storage_type *)0xd;
    QVar20.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar20);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,deltaPos);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::~QDebug(&local_58);
  }
  p = startPos + deltaPos;
  if (((startPos < dVar13) && (p < dVar13)) || ((dVar12 < startPos && (dVar12 < p)))) {
    local_b8 = pQVar1->overshootScrollTime * 0.7;
    local_138 = (double)(~-(ulong)(p < dVar13) & (ulong)dVar12 |
                        (ulong)dVar13 & -(ulong)(p < dVar13));
    local_118 = local_138 - startPos;
    TVar5 = QEasingCurve::type();
    type = ScrollTypeOvershoot;
  }
  else {
    local_138 = nextSnapPos(this,p,0,orientation);
    qVar9 = nextSnapPos(this,startPos,-1,orientation);
    dVar10 = nextSnapPos(this,startPos,1,orientation);
    lcScroller();
    if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_78 = 2;
      local_74 = 0;
      uStack_6c = 0;
      local_64 = 0;
      local_60 = lcScroller::category.name;
      QMessageLogger::debug();
      QVar2.stream = local_58.stream;
      QVar21.m_data = (storage_type *)0xd;
      QVar21.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar21);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
      if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
        UNLOCK();
        if (*(int *)local_50[0].stream == 0) {
          QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
        }
      }
      if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_58.stream,qVar9);
      if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_58.stream,'-');
      if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_58.stream,local_138);
      if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_58.stream,'-');
      if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_58.stream,dVar10);
      if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QDebug::~QDebug(&local_58);
    }
    if ((dVar10 < local_138) || (cVar3 = qIsNaN(dVar10), cVar3 != '\0')) {
      dVar10 = local_138;
    }
    if ((local_138 < qVar9) || (cVar3 = qIsNaN(qVar9), cVar3 != '\0')) {
      qVar9 = local_138;
    }
    uVar8 = -(ulong)(v < -v);
    if (pQVar1->minimumVelocity <= (double)(~uVar8 & (ulong)v | (ulong)-v & uVar8)) {
      if ((v <= 0.0) || (cVar3 = qIsNaN(dVar10), cVar3 != '\0')) {
        if ((v < 0.0) && (cVar3 = qIsNaN(qVar9), cVar3 == '\0')) {
          dVar10 = qVar9;
          if (p - startPos == 0.0) goto joined_r0x00658752;
          goto LAB_00658758;
        }
        local_138 = p;
        local_b8 = deltaTime;
        if (p < dVar13 || dVar12 < p) {
          local_138 = (double)(~-(ulong)(p < dVar13) & (ulong)dVar12 |
                              (ulong)dVar13 & -(ulong)(p < dVar13));
          lcScroller();
          if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             ) {
            local_78 = 2;
            local_74 = 0;
            uStack_6c = 0;
            local_64 = 0;
            local_60 = lcScroller::category.name;
            QMessageLogger::debug();
            QVar2.stream = local_58.stream;
            QVar23.m_data = (storage_type *)0x11;
            QVar23.m_size = (qsizetype)local_50;
            QString::fromUtf8(QVar23);
            QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
            if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
              UNLOCK();
              if (*(int *)local_50[0].stream == 0) {
                QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
              }
            }
            if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_58.stream,' ');
            }
            QTextStream::operator<<((QTextStream *)local_58.stream,local_138 - startPos);
            if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_58.stream,' ');
            }
            QDebug::~QDebug(&local_58);
          }
          if (bVar6) {
            dVar13 = (local_138 - startPos) / deltaPos;
            uVar8 = -(ulong)(dVar13 < -dVar13);
            qVar9 = progressForValue(&pQVar1->scrollingCurve,
                                     (qreal)(~uVar8 & (ulong)dVar13 | (ulong)-dVar13 & uVar8));
            local_b8 = pQVar1->overshootScrollTime;
            local_a8 = (local_b8 * 0.3) / deltaTime + qVar9;
            if (1.0 <= local_a8) {
              local_a8 = 1.0;
            }
            dVar13 = (double)QEasingCurve::valueForProgress(local_a8);
            local_108 = (dVar13 * deltaPos + startPos) - local_138;
            dVar13 = dVar11 * pQVar1->overshootScrollDistanceFactor *
                     (double)(-(ulong)(local_108 < 0.0) & 0xbff0000000000000 |
                             ~-(ulong)(local_108 < 0.0) &
                             -(ulong)(0.0 < local_108) & 0x3ff0000000000000);
            lcScroller();
            if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
                0) {
              local_78 = 2;
              local_74 = 0;
              uStack_6c = 0;
              local_64 = 0;
              local_60 = lcScroller::category.name;
              QMessageLogger::debug();
              QVar2.stream = local_58.stream;
              QVar24.m_data = (storage_type *)0xc;
              QVar24.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar24);
              QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
              if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                LOCK();
                *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                UNLOCK();
                if (*(int *)local_50[0].stream == 0) {
                  QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                }
              }
              if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QTextStream::operator<<((QTextStream *)local_58.stream,local_108);
              if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QVar2.stream = local_58.stream;
              QVar25.m_data = (storage_type *)0x4;
              QVar25.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar25);
              QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
              if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                LOCK();
                *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                UNLOCK();
                if (*(int *)local_50[0].stream == 0) {
                  QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                }
              }
              if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QTextStream::operator<<((QTextStream *)local_58.stream,dVar13);
              if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QVar2.stream = local_58.stream;
              QVar26.m_data = (storage_type *)0xc;
              QVar26.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar26);
              QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
              if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                LOCK();
                *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                UNLOCK();
                if (*(int *)local_50[0].stream == 0) {
                  QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                }
              }
              if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QTextStream::operator<<((QTextStream *)local_58.stream,qVar9);
              if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QTextStream::operator<<((QTextStream *)local_58.stream,local_a8);
              if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QDebug::~QDebug(&local_58);
            }
            local_118 = -local_108;
            dVar12 = -dVar13;
            if ((double)(~-(ulong)(local_108 < local_118) & (ulong)local_108 |
                        -(ulong)(local_108 < local_118) & (ulong)local_118) <=
                (double)(~-(ulong)(dVar13 < dVar12) & (ulong)dVar13 |
                        -(ulong)(dVar13 < dVar12) & (ulong)dVar12)) {
              local_108 = local_138 + local_108;
            }
            else {
              local_108 = local_138 + dVar13;
              dVar11 = (local_108 - startPos) / deltaPos;
              uVar8 = -(ulong)(dVar11 < -dVar11);
              local_a8 = progressForValue(&pQVar1->scrollingCurve,
                                          (qreal)(~uVar8 & (ulong)dVar11 | (ulong)-dVar11 & uVar8));
              lcScroller();
              local_118 = dVar12;
              if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                  != 0) {
                local_78 = 2;
                local_74 = 0;
                uStack_6c = 0;
                local_64 = 0;
                local_60 = lcScroller::category.name;
                QMessageLogger::debug();
                QVar2.stream = local_58.stream;
                QVar27.m_data = (storage_type *)0xc;
                QVar27.m_size = (qsizetype)local_50;
                QString::fromUtf8(QVar27);
                QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
                if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                  UNLOCK();
                  if (*(int *)local_50[0].stream == 0) {
                    QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                  }
                }
                if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QTextStream::operator<<((QTextStream *)local_58.stream,dVar13);
                if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QVar2.stream = local_58.stream;
                QVar28.m_data = (storage_type *)0x4;
                QVar28.m_size = (qsizetype)local_50;
                QString::fromUtf8(QVar28);
                QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
                if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                  UNLOCK();
                  if (*(int *)local_50[0].stream == 0) {
                    QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                  }
                }
                if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QTextStream::operator<<((QTextStream *)local_58.stream,dVar13);
                if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QVar2.stream = local_58.stream;
                QVar29.m_data = (storage_type *)0xc;
                QVar29.m_size = (qsizetype)local_50;
                QString::fromUtf8(QVar29);
                QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
                if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                  UNLOCK();
                  if (*(int *)local_50[0].stream == 0) {
                    QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                  }
                }
                if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QTextStream::operator<<((QTextStream *)local_58.stream,qVar9);
                if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QTextStream::operator<<((QTextStream *)local_58.stream,local_a8);
                if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QDebug::~QDebug(&local_58);
              }
            }
            TVar5 = QEasingCurve::type();
            pushSegment(this,ScrollTypeFlick,deltaTime,local_a8,startPos,deltaPos,local_108,TVar5,
                        orientation);
            local_b8 = local_b8 * 0.7;
            TVar5 = QEasingCurve::type();
            type = ScrollTypeOvershoot;
            startPos = local_108;
            goto LAB_006579c5;
          }
        }
      }
      else {
        if (p - startPos == 0.0) {
joined_r0x00658752:
          if (NAN(p - startPos)) goto LAB_00658758;
        }
        else {
LAB_00658758:
          dVar13 = (dVar10 - startPos) / (p - startPos);
          uVar8 = -(ulong)(dVar13 < -dVar13);
          deltaTime = deltaTime * (double)(~uVar8 & (ulong)dVar13 | (ulong)-dVar13 & uVar8);
        }
        local_b8 = pQVar1->snapTime;
        local_138 = dVar10;
        if (deltaTime <= local_b8) {
          local_b8 = deltaTime;
        }
      }
      TVar5 = QEasingCurve::type();
      type = ScrollTypeFlick;
      local_118 = deltaPos;
    }
    else {
      lcScroller();
      if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_78 = 2;
        local_74 = 0;
        uStack_6c = 0;
        local_64 = 0;
        local_60 = lcScroller::category.name;
        QMessageLogger::debug();
        QVar2.stream = local_58.stream;
        QVar22.m_data = (storage_type *)0x15;
        QVar22.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar22);
        QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
        if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
          UNLOCK();
          if (*(int *)local_50[0].stream == 0) {
            QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
          }
        }
        if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_58.stream,' ');
        }
        *(int *)((QTextStream *)local_58.stream + 0x28) =
             *(int *)((QTextStream *)local_58.stream + 0x28) + 2;
        qt_QMetaEnum_flagDebugOperator
                  (&local_90,(ulonglong)local_50,(QMetaObject *)(ulong)orientation,
                   (char *)&Qt::staticMetaObject);
        QDebug::~QDebug(local_50);
        QDebug::~QDebug(&local_90);
        QDebug::~QDebug(&local_98);
        QDebug::~QDebug(&local_58);
      }
      cVar3 = qIsNaN(local_138);
      if (local_138 == startPos || cVar3 != '\0') goto LAB_006579ce;
      dVar13 = pQVar1->snapPositionRatio;
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        dVar12 = (&(this->lastPosition).xp)[orientation != Horizontal] -
                 (&(this->pressPosition).xp)[orientation != Horizontal];
        dVar13 = dVar12 / dVar13;
        uVar8 = -(ulong)(dVar13 < -dVar13);
        if ((double)(~uVar8 & (ulong)dVar13 | (ulong)-dVar13 & uVar8) <= dVar10 - qVar9) {
          uVar8 = -(ulong)(dVar12 < 0.0);
          local_138 = (double)(~uVar8 & (ulong)dVar10 | (ulong)qVar9 & uVar8);
        }
      }
      dVar13 = (local_138 - startPos) * 0.3 + startPos;
      pushSegment(this,ScrollTypeFlick,pQVar1->snapTime * 0.3,1.0,startPos,dVar13 - startPos,dVar13,
                  InQuad,orientation);
      local_b8 = pQVar1->snapTime * 0.7;
      local_118 = local_138 - dVar13;
      TVar5 = QEasingCurve::type();
      type = ScrollTypeFlick;
      startPos = dVar13;
    }
  }
LAB_006579c5:
  pushSegment(this,type,local_b8,1.0,startPos,local_118,local_138,TVar5,orientation);
LAB_006579ce:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollerPrivate::createScrollingSegments(qreal v, qreal startPos,
                                               qreal deltaTime, qreal deltaPos,
                                               Qt::Orientation orientation)
{
    const QScrollerPropertiesPrivate *sp = properties.d.data();

    QScrollerProperties::OvershootPolicy policy;
    qreal minPos;
    qreal maxPos;
    qreal viewSize;

    if (orientation == Qt::Horizontal) {
        xSegments.clear();
        policy = sp->hOvershootPolicy;
        minPos = contentPosRange.left();
        maxPos = contentPosRange.right();
        viewSize = viewportSize.width();
    } else {
        ySegments.clear();
        policy = sp->vOvershootPolicy;
        minPos = contentPosRange.top();
        maxPos = contentPosRange.bottom();
        viewSize = viewportSize.height();
    }

    bool alwaysOvershoot = (policy == QScrollerProperties::OvershootAlwaysOn);
    bool noOvershoot = (policy == QScrollerProperties::OvershootAlwaysOff) || !sp->overshootScrollDistanceFactor;
    bool canOvershoot = !noOvershoot && (alwaysOvershoot || maxPos);

    qCDebug(lcScroller) << "+++ createScrollingSegments: s:" << startPos << "maxPos:" << maxPos
                        << "o:" << int(orientation);

    qCDebug(lcScroller) << "v = " << v << ", decelerationFactor = " << sp->decelerationFactor
                        << ", curveType = " << sp->scrollingCurve.type();

    qreal endPos = startPos + deltaPos;

    qCDebug(lcScroller) << "  Real Delta:" << deltaPos;

    // -- check if are in overshoot and end in overshoot
    if ((startPos < minPos && endPos < minPos) ||
        (startPos > maxPos && endPos > maxPos)) {
        qreal stopPos = endPos < minPos ? minPos : maxPos;
        qreal oDeltaTime = sp->overshootScrollTime;

        pushSegment(ScrollTypeOvershoot, oDeltaTime * qreal(0.7), qreal(1.0), startPos,
                    stopPos - startPos, stopPos, sp->scrollingCurve.type(), orientation);
        return;
    }

    // -- determine snap points
    qreal nextSnap = nextSnapPos(endPos, 0, orientation);
    qreal lowerSnapPos = nextSnapPos(startPos, -1, orientation);
    qreal higherSnapPos = nextSnapPos(startPos, 1, orientation);

    qCDebug(lcScroller) << "  Real Delta:" << lowerSnapPos << '-' << nextSnap << '-' <<higherSnapPos;

    // - check if we can reach another snap point
    if (nextSnap > higherSnapPos || qIsNaN(higherSnapPos))
        higherSnapPos = nextSnap;
    if (nextSnap < lowerSnapPos || qIsNaN(lowerSnapPos))
        lowerSnapPos = nextSnap;

    if (qAbs(v) < sp->minimumVelocity) {

        qCDebug(lcScroller) << "### below minimum Vel" << orientation;

        // - no snap points or already at one
        if (qIsNaN(nextSnap) || nextSnap == startPos)
            return; // nothing to do, no scrolling needed.

        // - decide which point to use

        qreal snapDistance = higherSnapPos - lowerSnapPos;

        qreal pressDistance = (orientation == Qt::Horizontal) ?
            lastPosition.x() - pressPosition.x() :
            lastPosition.y() - pressPosition.y();

        // if not dragged far enough, pick the next snap point.
        if (sp->snapPositionRatio == 0.0 || qAbs(pressDistance / sp->snapPositionRatio) > snapDistance)
            endPos = nextSnap;
        else if (pressDistance < 0.0)
            endPos = lowerSnapPos;
        else
            endPos = higherSnapPos;

        deltaPos = endPos - startPos;
        qreal midPos = startPos + deltaPos * qreal(0.3);
        pushSegment(ScrollTypeFlick, sp->snapTime * qreal(0.3), qreal(1.0), startPos,
                    midPos - startPos, midPos, QEasingCurve::InQuad, orientation);
        pushSegment(ScrollTypeFlick, sp->snapTime * qreal(0.7), qreal(1.0), midPos,
                    endPos - midPos, endPos, sp->scrollingCurve.type(), orientation);
        return;
    }

    // - go to the next snappoint if there is one
    if (v > 0 && !qIsNaN(higherSnapPos)) {
        // change the time in relation to the changed end position
        if (endPos - startPos)
            deltaTime *= qAbs((higherSnapPos - startPos) / (endPos - startPos));
        if (deltaTime > sp->snapTime)
            deltaTime = sp->snapTime;
        endPos = higherSnapPos;

    } else if (v < 0 && !qIsNaN(lowerSnapPos)) {
        // change the time in relation to the changed end position
        if (endPos - startPos)
            deltaTime *= qAbs((lowerSnapPos - startPos) / (endPos - startPos));
        if (deltaTime > sp->snapTime)
            deltaTime = sp->snapTime;
        endPos = lowerSnapPos;

    // -- check if we are overshooting
    } else if (endPos < minPos || endPos > maxPos) {
        qreal stopPos = endPos < minPos ? minPos : maxPos;

        qCDebug(lcScroller) << "Overshoot: delta:" << (stopPos - startPos);

        if (!canOvershoot) {
            pushSegment(ScrollTypeFlick, deltaTime, qreal(1), startPos, deltaPos, stopPos,
                        sp->scrollingCurve.type(), orientation);
        } else {
            qreal stopProgress = progressForValue(sp->scrollingCurve, qAbs((stopPos - startPos) / deltaPos));
            qreal oDeltaTime = sp->overshootScrollTime;
            qreal oStopProgress = qMin(stopProgress + oDeltaTime * qreal(0.3) / deltaTime, qreal(1));
            qreal oDistance = startPos + deltaPos * sp->scrollingCurve.valueForProgress(oStopProgress) - stopPos;
            qreal oMaxDistance = qSign(oDistance) * (viewSize * sp->overshootScrollDistanceFactor);

            qCDebug(lcScroller) << "1 oDistance:" << oDistance << "Max:" << oMaxDistance
                                << "stopP/oStopP" << stopProgress << oStopProgress;

            if (qAbs(oDistance) > qAbs(oMaxDistance)) {
                oStopProgress = progressForValue(sp->scrollingCurve,
                                                 qAbs((stopPos + oMaxDistance - startPos) / deltaPos));
                oDistance = oMaxDistance;
                qCDebug(lcScroller) << "2 oDistance:" << oDistance << "Max:" << oMaxDistance
                                    << "stopP/oStopP" << stopProgress << oStopProgress;
            }

            pushSegment(ScrollTypeFlick, deltaTime, oStopProgress, startPos, deltaPos,
                        stopPos + oDistance, sp->scrollingCurve.type(), orientation);
            pushSegment(ScrollTypeOvershoot, oDeltaTime * qreal(0.7), qreal(1.0),
                        stopPos + oDistance, -oDistance, stopPos, sp->scrollingCurve.type(),
                        orientation);
        }
        return;
    }

    pushSegment(ScrollTypeFlick, deltaTime, qreal(1.0), startPos, deltaPos, endPos,
                sp->scrollingCurve.type(), orientation);
}